

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O3

Matrix<unsigned_char> *
ZXing::ToMatrix<unsigned_char>
          (Matrix<unsigned_char> *__return_storage_ptr__,BitMatrix *in,uchar black,uchar white)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int y;
  
  y = 0;
  Matrix<unsigned_char>::Matrix(__return_storage_ptr__,in->_width,in->_height,'\0');
  iVar4 = in->_height;
  if (0 < iVar4) {
    iVar3 = in->_width;
    do {
      if (0 < iVar3) {
        lVar5 = 0;
        do {
          bVar1 = BitMatrix::get(in,(int)lVar5,y);
          uVar2 = white;
          if (bVar1) {
            uVar2 = black;
          }
          (__return_storage_ptr__->_data).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5 + (long)__return_storage_ptr__->_width * (long)y] =
               uVar2;
          iVar3 = in->_width;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < iVar3);
        iVar4 = in->_height;
      }
      y = y + 1;
    } while (y < iVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> ToMatrix(const BitMatrix& in, T black = 0, T white = ~0)
{
	Matrix<T> res(in.width(), in.height());
	for (int y = 0; y < in.height(); ++y)
		for (int x = 0; x < in.width(); ++x)
			res.set(x, y, in.get(x, y) ? black : white);
	return res;
}